

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20240722::debugging_internal::ParseClassEnumType(State *state)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  ParseState copy;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (iVar1 < 0x20000 && iVar5 < 0x100) {
    iVar5 = (state->parse_state).mangled_idx;
    iVar1 = (state->parse_state).out_cur_idx;
    iVar2 = (state->parse_state).prev_name_idx;
    uVar3 = *(undefined4 *)&(state->parse_state).field_0xc;
    bVar4 = ParseTwoCharToken(state,"Ts");
    if (!bVar4) {
      bVar4 = ParseTwoCharToken(state,"Tu");
      if (!bVar4) {
        ParseTwoCharToken(state,"Te");
      }
    }
    bVar4 = ParseName(state);
    if (!bVar4) {
      (state->parse_state).mangled_idx = iVar5;
      (state->parse_state).out_cur_idx = iVar1;
      (state->parse_state).prev_name_idx = iVar2;
      *(undefined4 *)&(state->parse_state).field_0xc = uVar3;
    }
    iVar5 = state->recursion_depth + -1;
  }
  else {
    bVar4 = false;
  }
  state->recursion_depth = iVar5;
  return bVar4;
}

Assistant:

static bool ParseClassEnumType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "Ts") ||
               ParseTwoCharToken(state, "Tu") ||
               ParseTwoCharToken(state, "Te")) &&
      ParseName(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}